

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_sbox_prove_s256_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,word256 mask_a,
               word256 mask_b,word256 mask_c)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  ulong *puVar40;
  ulong uVar41;
  ulong uVar42;
  long in_RCX;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  long in_RDX;
  ulong uVar48;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  uint m_4;
  word256 tmp2_2;
  word256 tmp1_2;
  uint j_2;
  uint m_3;
  word256 tmp2_1;
  word256 tmp1_1;
  uint j_1;
  uint m_2;
  word256 tmp2;
  word256 tmp1;
  uint j;
  uint m_1;
  word256 tmp;
  uint m;
  word256 x2m [3];
  word256 x1s [3];
  word256 x0s [3];
  word256 r2m [3];
  word256 r1s [3];
  word256 r1m [3];
  word256 r0s [3];
  word256 r0m [3];
  uint local_1624;
  uint local_15c4;
  uint local_1564;
  uint local_1504;
  uint local_14c4;
  ulong local_14c0 [12];
  ulong local_1460 [12];
  ulong local_1400 [12];
  ulong local_13a0 [12];
  ulong local_1340 [24];
  ulong auStack_1280 [40];
  ulong *local_1140;
  ulong *local_1138;
  undefined1 (*local_1130) [32];
  undefined1 (*local_1128) [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [32];
  undefined1 local_f80 [32];
  undefined1 local_f60 [32];
  undefined1 local_f40 [32];
  undefined4 local_f04;
  ulong local_f00;
  ulong uStack_ef8;
  ulong uStack_ef0;
  ulong uStack_ee8;
  undefined4 local_ec4;
  ulong local_ec0;
  ulong uStack_eb8;
  ulong uStack_eb0;
  ulong uStack_ea8;
  undefined4 local_e84;
  ulong local_e80;
  ulong uStack_e78;
  ulong uStack_e70;
  ulong uStack_e68;
  undefined4 local_e44;
  ulong local_e40;
  ulong uStack_e38;
  ulong uStack_e30;
  ulong uStack_e28;
  undefined4 local_e04;
  undefined1 local_e00 [32];
  undefined4 local_dc4;
  undefined1 local_dc0 [32];
  undefined4 local_d84;
  undefined1 local_d80 [32];
  undefined4 local_d44;
  undefined1 local_d40 [32];
  ulong local_d20;
  ulong uStack_d18;
  ulong uStack_d10;
  ulong uStack_d08;
  ulong local_d00;
  ulong uStack_cf8;
  ulong uStack_cf0;
  ulong uStack_ce8;
  ulong local_ce0;
  ulong uStack_cd8;
  ulong uStack_cd0;
  ulong uStack_cc8;
  ulong local_cc0;
  ulong uStack_cb8;
  ulong uStack_cb0;
  ulong uStack_ca8;
  ulong local_ca0;
  ulong uStack_c98;
  ulong uStack_c90;
  ulong uStack_c88;
  ulong local_c80;
  ulong uStack_c78;
  ulong uStack_c70;
  ulong uStack_c68;
  ulong local_c60;
  ulong uStack_c58;
  ulong uStack_c50;
  ulong uStack_c48;
  ulong local_c40;
  ulong uStack_c38;
  ulong uStack_c30;
  ulong uStack_c28;
  ulong local_c20;
  ulong uStack_c18;
  ulong uStack_c10;
  ulong uStack_c08;
  ulong local_c00;
  ulong uStack_bf8;
  ulong uStack_bf0;
  ulong uStack_be8;
  ulong local_be0;
  ulong uStack_bd8;
  ulong uStack_bd0;
  ulong uStack_bc8;
  ulong local_bc0;
  ulong uStack_bb8;
  ulong uStack_bb0;
  ulong uStack_ba8;
  ulong local_ba0;
  ulong uStack_b98;
  ulong uStack_b90;
  ulong uStack_b88;
  ulong local_b80;
  ulong uStack_b78;
  ulong uStack_b70;
  ulong uStack_b68;
  ulong local_b60;
  ulong uStack_b58;
  ulong uStack_b50;
  ulong uStack_b48;
  ulong local_b40;
  ulong uStack_b38;
  ulong uStack_b30;
  ulong uStack_b28;
  ulong local_b20;
  ulong uStack_b18;
  ulong uStack_b10;
  ulong uStack_b08;
  ulong local_b00;
  ulong uStack_af8;
  ulong uStack_af0;
  ulong uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined4 local_844;
  ulong local_840;
  ulong uStack_838;
  ulong uStack_830;
  ulong uStack_828;
  undefined4 local_804;
  ulong local_800;
  ulong uStack_7f8;
  ulong uStack_7f0;
  ulong uStack_7e8;
  undefined4 local_7c4;
  ulong local_7c0;
  ulong uStack_7b8;
  ulong uStack_7b0;
  ulong uStack_7a8;
  undefined4 local_784;
  ulong local_780;
  ulong uStack_778;
  ulong uStack_770;
  ulong uStack_768;
  undefined4 local_744;
  undefined1 local_740 [32];
  undefined4 local_704;
  undefined1 local_700 [32];
  undefined4 local_6c4;
  undefined1 local_6c0 [32];
  undefined4 local_684;
  undefined1 local_680 [32];
  ulong local_660;
  ulong uStack_658;
  ulong uStack_650;
  ulong uStack_648;
  ulong local_640;
  ulong uStack_638;
  ulong uStack_630;
  ulong uStack_628;
  ulong local_620;
  ulong uStack_618;
  ulong uStack_610;
  ulong uStack_608;
  ulong local_600;
  ulong uStack_5f8;
  ulong uStack_5f0;
  ulong uStack_5e8;
  ulong local_5e0;
  ulong uStack_5d8;
  ulong uStack_5d0;
  ulong uStack_5c8;
  ulong local_5c0;
  ulong uStack_5b8;
  ulong uStack_5b0;
  ulong uStack_5a8;
  ulong local_5a0;
  ulong uStack_598;
  ulong uStack_590;
  ulong uStack_588;
  ulong local_580;
  ulong uStack_578;
  ulong uStack_570;
  ulong uStack_568;
  ulong local_560;
  ulong uStack_558;
  ulong uStack_550;
  ulong uStack_548;
  ulong local_540;
  ulong uStack_538;
  ulong uStack_530;
  ulong uStack_528;
  ulong local_520;
  ulong uStack_518;
  ulong uStack_510;
  ulong uStack_508;
  ulong local_500;
  ulong uStack_4f8;
  ulong uStack_4f0;
  ulong uStack_4e8;
  ulong local_4e0;
  ulong uStack_4d8;
  ulong uStack_4d0;
  ulong uStack_4c8;
  ulong local_4c0;
  ulong uStack_4b8;
  ulong uStack_4b0;
  ulong uStack_4a8;
  ulong local_4a0;
  ulong uStack_498;
  ulong uStack_490;
  ulong uStack_488;
  undefined1 local_480 [32];
  ulong local_460;
  ulong uStack_458;
  ulong uStack_450;
  ulong uStack_448;
  ulong local_440;
  ulong uStack_438;
  ulong uStack_430;
  ulong uStack_428;
  undefined1 local_420 [32];
  ulong local_400;
  ulong uStack_3f8;
  ulong uStack_3f0;
  ulong uStack_3e8;
  ulong local_3e0;
  ulong uStack_3d8;
  ulong uStack_3d0;
  ulong uStack_3c8;
  ulong local_3c0;
  ulong uStack_3b8;
  ulong uStack_3b0;
  ulong uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  ulong local_360;
  ulong uStack_358;
  ulong uStack_350;
  ulong uStack_348;
  undefined1 local_340 [32];
  ulong local_320;
  ulong uStack_318;
  ulong uStack_310;
  ulong uStack_308;
  ulong local_300;
  ulong uStack_2f8;
  ulong uStack_2f0;
  ulong uStack_2e8;
  undefined1 local_2e0 [32];
  ulong local_2c0;
  ulong uStack_2b8;
  ulong uStack_2b0;
  ulong uStack_2a8;
  ulong local_2a0;
  ulong uStack_298;
  ulong uStack_290;
  ulong uStack_288;
  ulong local_280;
  ulong uStack_278;
  ulong uStack_270;
  ulong local_260;
  ulong uStack_258;
  ulong uStack_250;
  ulong uStack_248;
  ulong local_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  ulong local_1e0;
  ulong uStack_1d8;
  ulong uStack_1d0;
  ulong uStack_1c8;
  ulong local_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong local_140;
  ulong uStack_138;
  ulong uStack_130;
  ulong uStack_128;
  
  for (local_14c4 = 0; local_14c4 < 3; local_14c4 = local_14c4 + 1) {
    local_1128 = (undefined1 (*) [32])(in_RSI + (ulong)local_14c4 * 0x20);
    local_880 = *(undefined8 *)*local_1128;
    uStack_878 = *(undefined8 *)(*local_1128 + 8);
    uStack_870 = *(undefined8 *)(*local_1128 + 0x10);
    uStack_868 = *(undefined8 *)(*local_1128 + 0x18);
    auVar37 = *local_1128;
    auVar36 = *local_1128;
    auVar1 = *local_1128;
    auVar35._8_8_ = in_XMM0_Qb;
    auVar35._0_8_ = in_XMM0_Qa;
    auVar35._16_8_ = in_YMM0_H;
    auVar35._24_8_ = in_register_00001218;
    local_d40 = vpand_avx2(*local_1128,auVar35);
    local_d44 = 2;
    local_f40 = vpsllq_avx2(local_d40,ZEXT416(2));
    local_8c0 = local_880;
    uStack_8b8 = uStack_878;
    uStack_8b0 = uStack_870;
    uStack_8a8 = uStack_868;
    auVar34._8_8_ = in_XMM0_Qb;
    auVar34._0_8_ = in_XMM0_Qa;
    auVar34._16_8_ = in_YMM0_H;
    auVar34._24_8_ = in_register_00001218;
    local_680 = vpand_avx2(*local_1128,auVar34);
    local_684 = 0x3e;
    auVar2 = vpsrlq_avx2(local_680,ZEXT416(0x3e));
    local_f60 = vpermq_avx2(auVar2,0x93);
    auVar2 = vpor_avx2(local_f40,local_f60);
    *(undefined1 (*) [32])(local_1400 + (ulong)local_14c4 * 4) = auVar2;
    local_900 = local_880;
    uStack_8f8 = uStack_878;
    uStack_8f0 = uStack_870;
    uStack_8e8 = uStack_868;
    auVar33._8_8_ = in_XMM1_Qb;
    auVar33._0_8_ = in_XMM1_Qa;
    auVar33._16_8_ = in_YMM1_H;
    auVar33._24_8_ = in_register_00001258;
    local_d80 = vpand_avx2(auVar1,auVar33);
    local_d84 = 1;
    local_f80 = vpsllq_avx2(local_d80,ZEXT416(1));
    local_940 = local_880;
    uStack_938 = uStack_878;
    uStack_930 = uStack_870;
    uStack_928 = uStack_868;
    auVar32._8_8_ = in_XMM1_Qb;
    auVar32._0_8_ = in_XMM1_Qa;
    auVar32._16_8_ = in_YMM1_H;
    auVar32._24_8_ = in_register_00001258;
    local_6c0 = vpand_avx2(auVar36,auVar32);
    local_6c4 = 0x3f;
    auVar2 = vpsrlq_avx2(local_6c0,ZEXT416(0x3f));
    local_fa0 = vpermq_avx2(auVar2,0x93);
    auVar2 = vpor_avx2(local_f80,local_fa0);
    *(undefined1 (*) [32])(local_1460 + (ulong)local_14c4 * 4) = auVar2;
    local_980 = local_880;
    uStack_978 = uStack_878;
    uStack_970 = uStack_870;
    uStack_968 = uStack_868;
    auVar31._8_8_ = in_XMM2_Qb;
    auVar31._0_8_ = in_XMM2_Qa;
    auVar31._16_8_ = in_YMM2_H;
    auVar31._24_8_ = in_register_00001298;
    auVar2 = vpand_avx2(auVar37,auVar31);
    *(undefined1 (*) [32])(local_14c0 + (ulong)local_14c4 * 4) = auVar2;
    local_1130 = (undefined1 (*) [32])(in_RCX + (ulong)local_14c4 * 0x20);
    local_9c0 = *(undefined8 *)*local_1130;
    uStack_9b8 = *(undefined8 *)(*local_1130 + 8);
    uStack_9b0 = *(undefined8 *)(*local_1130 + 0x10);
    uStack_9a8 = *(undefined8 *)(*local_1130 + 0x18);
    auVar37 = *local_1130;
    auVar36 = *local_1130;
    auVar1 = *local_1130;
    auVar30._8_8_ = in_XMM0_Qb;
    auVar30._0_8_ = in_XMM0_Qa;
    auVar30._16_8_ = in_YMM0_H;
    auVar30._24_8_ = in_register_00001218;
    local_dc0 = vpand_avx2(*local_1130,auVar30);
    local_dc4 = 2;
    local_fc0 = vpsllq_avx2(local_dc0,ZEXT416(2));
    local_a00 = local_9c0;
    uStack_9f8 = uStack_9b8;
    uStack_9f0 = uStack_9b0;
    uStack_9e8 = uStack_9a8;
    auVar29._8_8_ = in_XMM0_Qb;
    auVar29._0_8_ = in_XMM0_Qa;
    auVar29._16_8_ = in_YMM0_H;
    auVar29._24_8_ = in_register_00001218;
    local_700 = vpand_avx2(*local_1130,auVar29);
    local_704 = 0x3e;
    auVar2 = vpsrlq_avx2(local_700,ZEXT416(0x3e));
    local_fe0 = vpermq_avx2(auVar2,0x93);
    auVar2 = vpor_avx2(local_fc0,local_fe0);
    *(undefined1 (*) [32])(auStack_1280 + (ulong)local_14c4 * 4) = auVar2;
    local_a40 = local_9c0;
    uStack_a38 = uStack_9b8;
    uStack_a30 = uStack_9b0;
    uStack_a28 = uStack_9a8;
    auVar28._8_8_ = in_XMM1_Qb;
    auVar28._0_8_ = in_XMM1_Qa;
    auVar28._16_8_ = in_YMM1_H;
    auVar28._24_8_ = in_register_00001258;
    local_e00 = vpand_avx2(auVar1,auVar28);
    local_e04 = 1;
    local_1000 = vpsllq_avx2(local_e00,ZEXT416(1));
    local_a80 = local_9c0;
    uStack_a78 = uStack_9b8;
    uStack_a70 = uStack_9b0;
    uStack_a68 = uStack_9a8;
    auVar27._8_8_ = in_XMM1_Qb;
    auVar27._0_8_ = in_XMM1_Qa;
    auVar27._16_8_ = in_YMM1_H;
    auVar27._24_8_ = in_register_00001258;
    local_740 = vpand_avx2(auVar36,auVar27);
    local_744 = 0x3f;
    auVar2 = vpsrlq_avx2(local_740,ZEXT416(0x3f));
    local_1020 = vpermq_avx2(auVar2,0x93);
    auVar2 = vpor_avx2(local_1000,local_1020);
    *(undefined1 (*) [32])(local_1340 + (ulong)local_14c4 * 4) = auVar2;
    local_ac0 = local_9c0;
    uStack_ab8 = uStack_9b8;
    uStack_ab0 = uStack_9b0;
    uStack_aa8 = uStack_9a8;
    auVar26._8_8_ = in_XMM2_Qb;
    auVar26._0_8_ = in_XMM2_Qa;
    auVar26._16_8_ = in_YMM2_H;
    auVar26._24_8_ = in_register_00001298;
    auVar2 = vpand_avx2(auVar37,auVar26);
    *(undefined1 (*) [32])(local_13a0 + (ulong)local_14c4 * 4) = auVar2;
  }
  for (local_1504 = 0; local_1504 < 3; local_1504 = local_1504 + 1) {
    uVar47 = (local_1504 + 1) % 3;
    uVar41 = (ulong)local_1504;
    uVar42 = (ulong)local_1504;
    local_b00 = local_1400[uVar41 * 4];
    uStack_af8 = local_1400[uVar41 * 4 + 1];
    uStack_af0 = local_1400[uVar41 * 4 + 2];
    uStack_ae8 = local_1400[uVar41 * 4 + 3];
    local_b20 = local_1460[uVar42 * 4];
    uStack_b18 = local_1460[uVar42 * 4 + 1];
    uStack_b10 = local_1460[uVar42 * 4 + 2];
    uStack_b08 = local_1460[uVar42 * 4 + 3];
    auVar25._8_8_ = local_1400[uVar41 * 4 + 1];
    auVar25._0_8_ = local_1400[uVar41 * 4];
    auVar25._16_8_ = local_1400[uVar41 * 4 + 2];
    auVar25._24_8_ = local_1400[uVar41 * 4 + 3];
    auVar24._8_8_ = local_1460[uVar42 * 4 + 1];
    auVar24._0_8_ = local_1460[uVar42 * 4];
    auVar24._16_8_ = local_1460[uVar42 * 4 + 2];
    auVar24._24_8_ = local_1460[uVar42 * 4 + 3];
    auVar2 = vpand_avx2(auVar25,auVar24);
    uVar41 = (ulong)uVar47;
    uVar42 = (ulong)local_1504;
    local_b40 = local_1400[uVar41 * 4];
    uStack_b38 = local_1400[uVar41 * 4 + 1];
    uStack_b30 = local_1400[uVar41 * 4 + 2];
    uStack_b28 = local_1400[uVar41 * 4 + 3];
    local_b60 = local_1460[uVar42 * 4];
    uStack_b58 = local_1460[uVar42 * 4 + 1];
    uStack_b50 = local_1460[uVar42 * 4 + 2];
    uStack_b48 = local_1460[uVar42 * 4 + 3];
    auVar23._8_8_ = local_1400[uVar41 * 4 + 1];
    auVar23._0_8_ = local_1400[uVar41 * 4];
    auVar23._16_8_ = local_1400[uVar41 * 4 + 2];
    auVar23._24_8_ = local_1400[uVar41 * 4 + 3];
    auVar22._8_8_ = local_1460[uVar42 * 4 + 1];
    auVar22._0_8_ = local_1460[uVar42 * 4];
    auVar22._16_8_ = local_1460[uVar42 * 4 + 2];
    auVar22._24_8_ = local_1460[uVar42 * 4 + 3];
    auVar1 = vpand_avx2(auVar23,auVar22);
    local_140 = auVar2._0_8_;
    uStack_138 = auVar2._8_8_;
    uStack_130 = auVar2._16_8_;
    uStack_128 = auVar2._24_8_;
    local_160 = auVar1._0_8_;
    uStack_158 = auVar1._8_8_;
    uStack_150 = auVar1._16_8_;
    uStack_148 = auVar1._24_8_;
    uVar43 = (ulong)local_1504;
    uVar41 = local_13a0[uVar43 * 4 + 1];
    uVar42 = local_13a0[uVar43 * 4 + 2];
    uVar3 = local_13a0[uVar43 * 4 + 3];
    uVar44 = (ulong)uVar47;
    uVar48 = local_13a0[uVar44 * 4 + 1];
    uVar4 = local_13a0[uVar44 * 4 + 2];
    uVar5 = local_13a0[uVar44 * 4 + 3];
    uVar45 = (ulong)local_1504;
    uVar46 = (ulong)uVar47;
    local_b80 = local_1400[uVar45 * 4];
    uStack_b78 = local_1400[uVar45 * 4 + 1];
    uStack_b70 = local_1400[uVar45 * 4 + 2];
    uStack_b68 = local_1400[uVar45 * 4 + 3];
    local_ba0 = local_1460[uVar46 * 4];
    uStack_b98 = local_1460[uVar46 * 4 + 1];
    uStack_b90 = local_1460[uVar46 * 4 + 2];
    uStack_b88 = local_1460[uVar46 * 4 + 3];
    auVar21._8_8_ = local_1400[uVar45 * 4 + 1];
    auVar21._0_8_ = local_1400[uVar45 * 4];
    auVar21._16_8_ = local_1400[uVar45 * 4 + 2];
    auVar21._24_8_ = local_1400[uVar45 * 4 + 3];
    auVar20._8_8_ = local_1460[uVar46 * 4 + 1];
    auVar20._0_8_ = local_1460[uVar46 * 4];
    auVar20._16_8_ = local_1460[uVar46 * 4 + 2];
    auVar20._24_8_ = local_1460[uVar46 * 4 + 3];
    auVar2 = vpand_avx2(auVar21,auVar20);
    local_1e0 = auVar2._0_8_;
    uStack_1d8 = auVar2._8_8_;
    uStack_1d0 = auVar2._16_8_;
    uStack_1c8 = auVar2._24_8_;
    uVar45 = (ulong)local_1504;
    auStack_1280[uVar45 * 4 + 0xc] =
         local_140 ^ local_160 ^ local_13a0[uVar43 * 4] ^ local_13a0[uVar44 * 4] ^ local_1e0;
    auStack_1280[uVar45 * 4 + 0xd] = uStack_138 ^ uStack_158 ^ uVar41 ^ uVar48 ^ uStack_1d8;
    auStack_1280[uVar45 * 4 + 0xe] = uStack_130 ^ uStack_150 ^ uVar42 ^ uVar4 ^ uStack_1d0;
    auStack_1280[uVar45 * 4 + 0xf] = uStack_128 ^ uStack_148 ^ uVar3 ^ uVar5 ^ uStack_1c8;
    puVar40 = (ulong *)(in_RDX + (ulong)local_1504 * 0x20);
    uVar48 = (ulong)local_1504;
    uVar41 = auStack_1280[uVar48 * 4 + 0xd];
    uVar42 = auStack_1280[uVar48 * 4 + 0xe];
    uVar3 = auStack_1280[uVar48 * 4 + 0xf];
    *puVar40 = auStack_1280[uVar48 * 4 + 0xc];
    puVar40[1] = uVar41;
    puVar40[2] = uVar42;
    puVar40[3] = uVar3;
  }
  for (local_1564 = 0; local_1564 < 3; local_1564 = local_1564 + 1) {
    uVar47 = local_1564 + 1 + ((local_1564 + 1) / 3) * -3;
    uVar41 = (ulong)local_1564;
    local_bc0 = local_1460[uVar41 * 4];
    uStack_bb8 = local_1460[uVar41 * 4 + 1];
    uStack_bb0 = local_1460[uVar41 * 4 + 2];
    uStack_ba8 = local_1460[uVar41 * 4 + 3];
    local_be0 = local_14c0[uVar41 * 4];
    uStack_bd8 = local_14c0[uVar41 * 4 + 1];
    uStack_bd0 = local_14c0[uVar41 * 4 + 2];
    uStack_bc8 = local_14c0[uVar41 * 4 + 3];
    auVar19._8_8_ = local_1460[uVar41 * 4 + 1];
    auVar19._0_8_ = local_1460[uVar41 * 4];
    auVar19._16_8_ = local_1460[uVar41 * 4 + 2];
    auVar19._24_8_ = local_1460[uVar41 * 4 + 3];
    auVar18._8_8_ = local_14c0[uVar41 * 4 + 1];
    auVar18._0_8_ = local_14c0[uVar41 * 4];
    auVar18._16_8_ = local_14c0[uVar41 * 4 + 2];
    auVar18._24_8_ = local_14c0[uVar41 * 4 + 3];
    auVar2 = vpand_avx2(auVar19,auVar18);
    uVar41 = (ulong)uVar47;
    uVar42 = (ulong)local_1564;
    local_c00 = local_1460[uVar41 * 4];
    uStack_bf8 = local_1460[uVar41 * 4 + 1];
    uStack_bf0 = local_1460[uVar41 * 4 + 2];
    uStack_be8 = local_1460[uVar41 * 4 + 3];
    local_c20 = local_14c0[uVar42 * 4];
    uStack_c18 = local_14c0[uVar42 * 4 + 1];
    uStack_c10 = local_14c0[uVar42 * 4 + 2];
    uStack_c08 = local_14c0[uVar42 * 4 + 3];
    auVar17._8_8_ = local_1460[uVar41 * 4 + 1];
    auVar17._0_8_ = local_1460[uVar41 * 4];
    auVar17._16_8_ = local_1460[uVar41 * 4 + 2];
    auVar17._24_8_ = local_1460[uVar41 * 4 + 3];
    auVar16._8_8_ = local_14c0[uVar42 * 4 + 1];
    auVar16._0_8_ = local_14c0[uVar42 * 4];
    auVar16._16_8_ = local_14c0[uVar42 * 4 + 2];
    auVar16._24_8_ = local_14c0[uVar42 * 4 + 3];
    auVar1 = vpand_avx2(auVar17,auVar16);
    local_240 = auVar2._0_8_;
    uStack_238 = auVar2._8_8_;
    uStack_230 = auVar2._16_8_;
    uStack_228 = auVar2._24_8_;
    local_260 = auVar1._0_8_;
    uStack_258 = auVar1._8_8_;
    uStack_250 = auVar1._16_8_;
    uStack_248 = auVar1._24_8_;
    uVar41 = (ulong)local_1564;
    uVar42 = (ulong)uVar47;
    local_280 = local_1340[uVar41 * 4];
    uStack_278 = local_1340[uVar41 * 4 + 1];
    uStack_270 = local_1340[uVar41 * 4 + 2];
    local_2a0 = local_1340[uVar42 * 4];
    uStack_298 = local_1340[uVar42 * 4 + 1];
    uStack_290 = local_1340[uVar42 * 4 + 2];
    uStack_288 = local_1340[uVar42 * 4 + 3];
    local_2c0 = local_1340[uVar41 * 4] ^ local_1340[uVar42 * 4];
    uStack_2b8 = local_1340[uVar41 * 4 + 1] ^ local_1340[uVar42 * 4 + 1];
    uStack_2b0 = local_1340[uVar41 * 4 + 2] ^ local_1340[uVar42 * 4 + 2];
    uStack_2a8 = local_1340[uVar41 * 4 + 3] ^ local_1340[uVar42 * 4 + 3];
    uVar41 = (ulong)local_1564;
    uVar42 = (ulong)uVar47;
    local_c40 = local_1460[uVar41 * 4];
    uStack_c38 = local_1460[uVar41 * 4 + 1];
    uStack_c30 = local_1460[uVar41 * 4 + 2];
    uStack_c28 = local_1460[uVar41 * 4 + 3];
    local_c60 = local_14c0[uVar42 * 4];
    uStack_c58 = local_14c0[uVar42 * 4 + 1];
    uStack_c50 = local_14c0[uVar42 * 4 + 2];
    uStack_c48 = local_14c0[uVar42 * 4 + 3];
    auVar15._8_8_ = local_1460[uVar41 * 4 + 1];
    auVar15._0_8_ = local_1460[uVar41 * 4];
    auVar15._16_8_ = local_1460[uVar41 * 4 + 2];
    auVar15._24_8_ = local_1460[uVar41 * 4 + 3];
    auVar14._8_8_ = local_14c0[uVar42 * 4 + 1];
    auVar14._0_8_ = local_14c0[uVar42 * 4];
    auVar14._16_8_ = local_14c0[uVar42 * 4 + 2];
    auVar14._24_8_ = local_14c0[uVar42 * 4 + 3];
    local_2e0 = vpand_avx2(auVar15,auVar14);
    local_320 = local_2c0 ^ local_2e0._0_8_;
    uStack_318 = uStack_2b8 ^ local_2e0._8_8_;
    uStack_310 = uStack_2b0 ^ local_2e0._16_8_;
    uStack_308 = uStack_2a8 ^ local_2e0._24_8_;
    local_300 = local_240 ^ local_260;
    uStack_2f8 = uStack_238 ^ uStack_258;
    uStack_2f0 = uStack_230 ^ uStack_250;
    uStack_2e8 = uStack_228 ^ uStack_248;
    uVar41 = (ulong)local_1564;
    local_13a0[uVar41 * 4] = local_240 ^ local_260 ^ local_320;
    local_13a0[uVar41 * 4 + 1] = uStack_238 ^ uStack_258 ^ uStack_318;
    local_13a0[uVar41 * 4 + 2] = uStack_230 ^ uStack_250 ^ uStack_310;
    local_13a0[uVar41 * 4 + 3] = uStack_228 ^ uStack_248 ^ uStack_308;
    uVar41 = (ulong)local_1564;
    puVar40 = (ulong *)(in_RDX + uVar41 * 0x20);
    local_780 = local_13a0[uVar41 * 4];
    uStack_778 = local_13a0[uVar41 * 4 + 1];
    uStack_770 = local_13a0[uVar41 * 4 + 2];
    uStack_768 = local_13a0[uVar41 * 4 + 3];
    local_784 = 1;
    auVar39._8_8_ = local_13a0[uVar41 * 4 + 1];
    auVar39._0_8_ = local_13a0[uVar41 * 4];
    auVar39._16_8_ = local_13a0[uVar41 * 4 + 2];
    auVar39._24_8_ = local_13a0[uVar41 * 4 + 3];
    local_1040 = vpsrlq_avx2(auVar39,ZEXT416(1));
    uVar41 = (ulong)local_1564;
    local_e40 = local_13a0[uVar41 * 4];
    uStack_e38 = local_13a0[uVar41 * 4 + 1];
    uStack_e30 = local_13a0[uVar41 * 4 + 2];
    uStack_e28 = local_13a0[uVar41 * 4 + 3];
    local_e44 = 0x3f;
    auVar7._8_8_ = local_13a0[uVar41 * 4 + 1];
    auVar7._0_8_ = local_13a0[uVar41 * 4];
    auVar7._16_8_ = local_13a0[uVar41 * 4 + 2];
    auVar7._24_8_ = local_13a0[uVar41 * 4 + 3];
    auVar2 = vpsllq_avx2(auVar7,ZEXT416(0x3f));
    local_1060 = vpermq_avx2(auVar2,0x39);
    local_340 = vpor_avx2(local_1040,local_1060);
    local_1138 = (ulong *)(in_RDX + (ulong)local_1564 * 0x20);
    uStack_358 = local_1138[1];
    uStack_350 = local_1138[2];
    uStack_348 = local_1138[3];
    local_360 = *local_1138;
    *puVar40 = local_340._0_8_ ^ *local_1138;
    puVar40[1] = local_340._8_8_ ^ uStack_358;
    puVar40[2] = local_340._16_8_ ^ uStack_350;
    puVar40[3] = local_340._24_8_ ^ uStack_348;
  }
  for (local_15c4 = 0; local_15c4 < 3; local_15c4 = local_15c4 + 1) {
    uVar47 = local_15c4 + 1 + ((local_15c4 + 1) / 3) * -3;
    uVar41 = (ulong)local_15c4;
    local_c80 = local_1400[uVar41 * 4];
    uStack_c78 = local_1400[uVar41 * 4 + 1];
    uStack_c70 = local_1400[uVar41 * 4 + 2];
    uStack_c68 = local_1400[uVar41 * 4 + 3];
    local_ca0 = local_14c0[uVar41 * 4];
    uStack_c98 = local_14c0[uVar41 * 4 + 1];
    uStack_c90 = local_14c0[uVar41 * 4 + 2];
    uStack_c88 = local_14c0[uVar41 * 4 + 3];
    auVar13._8_8_ = local_1400[uVar41 * 4 + 1];
    auVar13._0_8_ = local_1400[uVar41 * 4];
    auVar13._16_8_ = local_1400[uVar41 * 4 + 2];
    auVar13._24_8_ = local_1400[uVar41 * 4 + 3];
    auVar12._8_8_ = local_14c0[uVar41 * 4 + 1];
    auVar12._0_8_ = local_14c0[uVar41 * 4];
    auVar12._16_8_ = local_14c0[uVar41 * 4 + 2];
    auVar12._24_8_ = local_14c0[uVar41 * 4 + 3];
    local_380 = vpand_avx2(auVar13,auVar12);
    uVar41 = (ulong)uVar47;
    uVar42 = (ulong)local_15c4;
    local_cc0 = local_1400[uVar41 * 4];
    uStack_cb8 = local_1400[uVar41 * 4 + 1];
    uStack_cb0 = local_1400[uVar41 * 4 + 2];
    uStack_ca8 = local_1400[uVar41 * 4 + 3];
    local_ce0 = local_14c0[uVar42 * 4];
    uStack_cd8 = local_14c0[uVar42 * 4 + 1];
    uStack_cd0 = local_14c0[uVar42 * 4 + 2];
    uStack_cc8 = local_14c0[uVar42 * 4 + 3];
    auVar11._8_8_ = local_1400[uVar41 * 4 + 1];
    auVar11._0_8_ = local_1400[uVar41 * 4];
    auVar11._16_8_ = local_1400[uVar41 * 4 + 2];
    auVar11._24_8_ = local_1400[uVar41 * 4 + 3];
    auVar10._8_8_ = local_14c0[uVar42 * 4 + 1];
    auVar10._0_8_ = local_14c0[uVar42 * 4];
    auVar10._16_8_ = local_14c0[uVar42 * 4 + 2];
    auVar10._24_8_ = local_14c0[uVar42 * 4 + 3];
    local_3a0 = vpand_avx2(auVar11,auVar10);
    uVar41 = (ulong)local_15c4;
    uVar42 = (ulong)uVar47;
    local_3c0 = auStack_1280[uVar41 * 4];
    uStack_3b8 = auStack_1280[uVar41 * 4 + 1];
    uStack_3b0 = auStack_1280[uVar41 * 4 + 2];
    uStack_3a8 = auStack_1280[uVar41 * 4 + 3];
    local_3e0 = auStack_1280[uVar42 * 4];
    uStack_3d8 = auStack_1280[uVar42 * 4 + 1];
    uStack_3d0 = auStack_1280[uVar42 * 4 + 2];
    uStack_3c8 = auStack_1280[uVar42 * 4 + 3];
    local_400 = auStack_1280[uVar41 * 4] ^ auStack_1280[uVar42 * 4];
    uStack_3f8 = auStack_1280[uVar41 * 4 + 1] ^ auStack_1280[uVar42 * 4 + 1];
    uStack_3f0 = auStack_1280[uVar41 * 4 + 2] ^ auStack_1280[uVar42 * 4 + 2];
    uStack_3e8 = auStack_1280[uVar41 * 4 + 3] ^ auStack_1280[uVar42 * 4 + 3];
    uVar41 = (ulong)local_15c4;
    uVar42 = (ulong)uVar47;
    local_d00 = local_1400[uVar41 * 4];
    uStack_cf8 = local_1400[uVar41 * 4 + 1];
    uStack_cf0 = local_1400[uVar41 * 4 + 2];
    uStack_ce8 = local_1400[uVar41 * 4 + 3];
    local_d20 = local_14c0[uVar42 * 4];
    uStack_d18 = local_14c0[uVar42 * 4 + 1];
    uStack_d10 = local_14c0[uVar42 * 4 + 2];
    uStack_d08 = local_14c0[uVar42 * 4 + 3];
    auVar9._8_8_ = local_1400[uVar41 * 4 + 1];
    auVar9._0_8_ = local_1400[uVar41 * 4];
    auVar9._16_8_ = local_1400[uVar41 * 4 + 2];
    auVar9._24_8_ = local_1400[uVar41 * 4 + 3];
    auVar8._8_8_ = local_14c0[uVar42 * 4 + 1];
    auVar8._0_8_ = local_14c0[uVar42 * 4];
    auVar8._16_8_ = local_14c0[uVar42 * 4 + 2];
    auVar8._24_8_ = local_14c0[uVar42 * 4 + 3];
    local_420 = vpand_avx2(auVar9,auVar8);
    local_460 = local_400 ^ local_420._0_8_;
    uStack_458 = uStack_3f8 ^ local_420._8_8_;
    uStack_450 = uStack_3f0 ^ local_420._16_8_;
    uStack_448 = uStack_3e8 ^ local_420._24_8_;
    local_440 = local_380._0_8_ ^ local_3a0._0_8_;
    uStack_438 = local_380._8_8_ ^ local_3a0._8_8_;
    uStack_430 = local_380._16_8_ ^ local_3a0._16_8_;
    uStack_428 = local_380._24_8_ ^ local_3a0._24_8_;
    uVar41 = (ulong)local_15c4;
    local_1340[uVar41 * 4 + 0xc] = local_380._0_8_ ^ local_3a0._0_8_ ^ local_460;
    auStack_1280[uVar41 * 4 + -0xb] = local_380._8_8_ ^ local_3a0._8_8_ ^ uStack_458;
    auStack_1280[uVar41 * 4 + -10] = local_380._16_8_ ^ local_3a0._16_8_ ^ uStack_450;
    auStack_1280[uVar41 * 4 + -9] = local_380._24_8_ ^ local_3a0._24_8_ ^ uStack_448;
    uVar41 = (ulong)local_15c4;
    puVar40 = (ulong *)(in_RDX + uVar41 * 0x20);
    local_7c0 = local_1340[uVar41 * 4 + 0xc];
    uStack_7b8 = auStack_1280[uVar41 * 4 + -0xb];
    uStack_7b0 = auStack_1280[uVar41 * 4 + -10];
    uStack_7a8 = auStack_1280[uVar41 * 4 + -9];
    local_7c4 = 2;
    auVar38._8_8_ = auStack_1280[uVar41 * 4 + -0xb];
    auVar38._0_8_ = local_1340[uVar41 * 4 + 0xc];
    auVar38._16_8_ = auStack_1280[uVar41 * 4 + -10];
    auVar38._24_8_ = auStack_1280[uVar41 * 4 + -9];
    local_1080 = vpsrlq_avx2(auVar38,ZEXT416(2));
    uVar41 = (ulong)local_15c4;
    local_e80 = local_1340[uVar41 * 4 + 0xc];
    uStack_e78 = auStack_1280[uVar41 * 4 + -0xb];
    uStack_e70 = auStack_1280[uVar41 * 4 + -10];
    uStack_e68 = auStack_1280[uVar41 * 4 + -9];
    local_e84 = 0x3e;
    auVar6._8_8_ = auStack_1280[uVar41 * 4 + -0xb];
    auVar6._0_8_ = local_1340[uVar41 * 4 + 0xc];
    auVar6._16_8_ = auStack_1280[uVar41 * 4 + -10];
    auVar6._24_8_ = auStack_1280[uVar41 * 4 + -9];
    auVar2 = vpsllq_avx2(auVar6,ZEXT416(0x3e));
    local_10a0 = vpermq_avx2(auVar2,0x39);
    local_480 = vpor_avx2(local_1080,local_10a0);
    local_1140 = (ulong *)(in_RDX + (ulong)local_15c4 * 0x20);
    uStack_498 = local_1140[1];
    uStack_490 = local_1140[2];
    uStack_488 = local_1140[3];
    local_4a0 = *local_1140;
    *puVar40 = local_480._0_8_ ^ *local_1140;
    puVar40[1] = local_480._8_8_ ^ uStack_498;
    puVar40[2] = local_480._16_8_ ^ uStack_490;
    puVar40[3] = local_480._24_8_ ^ uStack_488;
  }
  for (local_1624 = 0; local_1624 < 3; local_1624 = local_1624 + 1) {
    uVar41 = (ulong)local_1624;
    uStack_4b8 = local_13a0[uVar41 * 4 + 1];
    uStack_4b0 = local_13a0[uVar41 * 4 + 2];
    uStack_4a8 = local_13a0[uVar41 * 4 + 3];
    uStack_4d8 = local_1400[uVar41 * 4 + 1];
    uStack_4d0 = local_1400[uVar41 * 4 + 2];
    uStack_4c8 = local_1400[uVar41 * 4 + 3];
    local_4c0 = local_13a0[uVar41 * 4];
    local_4e0 = local_1400[uVar41 * 4];
    uVar42 = (ulong)local_1624;
    local_13a0[uVar42 * 4] = local_13a0[uVar41 * 4] ^ local_1400[uVar41 * 4];
    local_13a0[uVar42 * 4 + 1] = uStack_4b8 ^ uStack_4d8;
    local_13a0[uVar42 * 4 + 2] = uStack_4b0 ^ uStack_4d0;
    local_13a0[uVar42 * 4 + 3] = uStack_4a8 ^ uStack_4c8;
    uVar41 = (ulong)local_1624;
    uStack_4f8 = local_1400[uVar41 * 4 + 1];
    uStack_4f0 = local_1400[uVar41 * 4 + 2];
    uStack_4e8 = local_1400[uVar41 * 4 + 3];
    uStack_518 = local_1460[uVar41 * 4 + 1];
    uStack_510 = local_1460[uVar41 * 4 + 2];
    uStack_508 = local_1460[uVar41 * 4 + 3];
    local_500 = local_1400[uVar41 * 4];
    local_520 = local_1460[uVar41 * 4];
    uVar42 = (ulong)local_1624;
    local_1400[uVar42 * 4] = local_1400[uVar41 * 4] ^ local_1460[uVar41 * 4];
    local_1400[uVar42 * 4 + 1] = uStack_4f8 ^ uStack_518;
    local_1400[uVar42 * 4 + 2] = uStack_4f0 ^ uStack_510;
    local_1400[uVar42 * 4 + 3] = uStack_4e8 ^ uStack_508;
    uVar41 = (ulong)local_1624;
    uStack_538 = local_1400[uVar41 * 4 + 1];
    uStack_530 = local_1400[uVar41 * 4 + 2];
    uStack_528 = local_1400[uVar41 * 4 + 3];
    uStack_558 = auStack_1280[uVar41 * 4 + -0xb];
    uStack_550 = auStack_1280[uVar41 * 4 + -10];
    uStack_548 = auStack_1280[uVar41 * 4 + -9];
    local_540 = local_1400[uVar41 * 4];
    local_560 = local_1340[uVar41 * 4 + 0xc];
    uVar42 = (ulong)local_1624;
    local_1340[uVar42 * 4 + 0xc] = local_1400[uVar41 * 4] ^ local_1340[uVar41 * 4 + 0xc];
    auStack_1280[uVar42 * 4 + -0xb] = uStack_538 ^ uStack_558;
    auStack_1280[uVar42 * 4 + -10] = uStack_530 ^ uStack_550;
    auStack_1280[uVar42 * 4 + -9] = uStack_528 ^ uStack_548;
    uVar41 = (ulong)local_1624;
    uStack_578 = local_1400[uVar41 * 4 + 1];
    uStack_570 = local_1400[uVar41 * 4 + 2];
    uStack_568 = local_1400[uVar41 * 4 + 3];
    uStack_598 = auStack_1280[uVar41 * 4 + 0xd];
    uStack_590 = auStack_1280[uVar41 * 4 + 0xe];
    uStack_588 = auStack_1280[uVar41 * 4 + 0xf];
    local_580 = local_1400[uVar41 * 4];
    local_5a0 = auStack_1280[uVar41 * 4 + 0xc];
    uVar42 = (ulong)local_1624;
    auStack_1280[uVar42 * 4 + 0xc] = local_1400[uVar41 * 4] ^ auStack_1280[uVar41 * 4 + 0xc];
    auStack_1280[uVar42 * 4 + 0xd] = uStack_578 ^ uStack_598;
    auStack_1280[uVar42 * 4 + 0xe] = uStack_570 ^ uStack_590;
    auStack_1280[uVar42 * 4 + 0xf] = uStack_568 ^ uStack_588;
    uVar41 = (ulong)local_1624;
    local_800 = local_13a0[uVar41 * 4];
    uStack_7f8 = local_13a0[uVar41 * 4 + 1];
    uStack_7f0 = local_13a0[uVar41 * 4 + 2];
    uStack_7e8 = local_13a0[uVar41 * 4 + 3];
    local_804 = 2;
    auVar37._8_8_ = local_13a0[uVar41 * 4 + 1];
    auVar37._0_8_ = local_13a0[uVar41 * 4];
    auVar37._16_8_ = local_13a0[uVar41 * 4 + 2];
    auVar37._24_8_ = local_13a0[uVar41 * 4 + 3];
    local_10c0 = vpsrlq_avx2(auVar37,ZEXT416(2));
    uVar41 = (ulong)local_1624;
    local_ec0 = local_13a0[uVar41 * 4];
    uStack_eb8 = local_13a0[uVar41 * 4 + 1];
    uStack_eb0 = local_13a0[uVar41 * 4 + 2];
    uStack_ea8 = local_13a0[uVar41 * 4 + 3];
    local_ec4 = 0x3e;
    auVar1._8_8_ = local_13a0[uVar41 * 4 + 1];
    auVar1._0_8_ = local_13a0[uVar41 * 4];
    auVar1._16_8_ = local_13a0[uVar41 * 4 + 2];
    auVar1._24_8_ = local_13a0[uVar41 * 4 + 3];
    auVar2 = vpsllq_avx2(auVar1,ZEXT416(0x3e));
    local_10e0 = vpermq_avx2(auVar2,0x39);
    auVar2 = vpor_avx2(local_10c0,local_10e0);
    *(undefined1 (*) [32])(local_1400 + (ulong)local_1624 * 4) = auVar2;
    uVar41 = (ulong)local_1624;
    local_840 = local_1340[uVar41 * 4 + 0xc];
    uStack_838 = auStack_1280[uVar41 * 4 + -0xb];
    uStack_830 = auStack_1280[uVar41 * 4 + -10];
    uStack_828 = auStack_1280[uVar41 * 4 + -9];
    local_844 = 1;
    auVar36._8_8_ = auStack_1280[uVar41 * 4 + -0xb];
    auVar36._0_8_ = local_1340[uVar41 * 4 + 0xc];
    auVar36._16_8_ = auStack_1280[uVar41 * 4 + -10];
    auVar36._24_8_ = auStack_1280[uVar41 * 4 + -9];
    local_1100 = vpsrlq_avx2(auVar36,ZEXT416(1));
    uVar41 = (ulong)local_1624;
    local_f00 = local_1340[uVar41 * 4 + 0xc];
    uStack_ef8 = auStack_1280[uVar41 * 4 + -0xb];
    uStack_ef0 = auStack_1280[uVar41 * 4 + -10];
    uStack_ee8 = auStack_1280[uVar41 * 4 + -9];
    local_f04 = 0x3f;
    auVar2._8_8_ = auStack_1280[uVar41 * 4 + -0xb];
    auVar2._0_8_ = local_1340[uVar41 * 4 + 0xc];
    auVar2._16_8_ = auStack_1280[uVar41 * 4 + -10];
    auVar2._24_8_ = auStack_1280[uVar41 * 4 + -9];
    auVar2 = vpsllq_avx2(auVar2,ZEXT416(0x3f));
    local_1120 = vpermq_avx2(auVar2,0x39);
    auVar2 = vpor_avx2(local_1100,local_1120);
    *(undefined1 (*) [32])(local_1460 + (ulong)local_1624 * 4) = auVar2;
    puVar40 = (ulong *)(in_RDI + (ulong)local_1624 * 0x20);
    uVar41 = (ulong)local_1624;
    uVar42 = (ulong)local_1624;
    local_5c0 = auStack_1280[uVar41 * 4 + 0xc];
    uStack_5b8 = auStack_1280[uVar41 * 4 + 0xd];
    uStack_5b0 = auStack_1280[uVar41 * 4 + 0xe];
    uStack_5a8 = auStack_1280[uVar41 * 4 + 0xf];
    local_5e0 = local_14c0[uVar42 * 4];
    uStack_5d8 = local_14c0[uVar42 * 4 + 1];
    uStack_5d0 = local_14c0[uVar42 * 4 + 2];
    uStack_5c8 = local_14c0[uVar42 * 4 + 3];
    local_640 = auStack_1280[uVar41 * 4 + 0xc] ^ local_14c0[uVar42 * 4];
    uStack_638 = auStack_1280[uVar41 * 4 + 0xd] ^ local_14c0[uVar42 * 4 + 1];
    uStack_630 = auStack_1280[uVar41 * 4 + 0xe] ^ local_14c0[uVar42 * 4 + 2];
    uStack_628 = auStack_1280[uVar41 * 4 + 0xf] ^ local_14c0[uVar42 * 4 + 3];
    uVar41 = (ulong)local_1624;
    uVar42 = (ulong)local_1624;
    local_600 = local_1400[uVar41 * 4];
    uStack_5f8 = local_1400[uVar41 * 4 + 1];
    uStack_5f0 = local_1400[uVar41 * 4 + 2];
    uStack_5e8 = local_1400[uVar41 * 4 + 3];
    local_620 = local_1460[uVar42 * 4];
    uStack_618 = local_1460[uVar42 * 4 + 1];
    uStack_610 = local_1460[uVar42 * 4 + 2];
    uStack_608 = local_1460[uVar42 * 4 + 3];
    local_660 = local_1400[uVar41 * 4] ^ local_1460[uVar42 * 4];
    uStack_658 = local_1400[uVar41 * 4 + 1] ^ local_1460[uVar42 * 4 + 1];
    uStack_650 = local_1400[uVar41 * 4 + 2] ^ local_1460[uVar42 * 4 + 2];
    uStack_648 = local_1400[uVar41 * 4 + 3] ^ local_1460[uVar42 * 4 + 3];
    *puVar40 = local_640 ^ local_660;
    puVar40[1] = uStack_638 ^ uStack_658;
    puVar40[2] = uStack_630 ^ uStack_650;
    puVar40[3] = uStack_628 ^ uStack_648;
  }
  return;
}

Assistant:

ATTR_TARGET_AVX2
static inline void mpc_sbox_prove_s256_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                           const rvec_t* rvec, const word256 mask_a,
                                           const word256 mask_b, const word256 mask_c) {
  bitsliced_mm256_step_1(SC_PROOF, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm256_and_def(r0m, x0s, x1s, r2m, 0);
  // b & c
  mpc_mm256_and_def(r2m, x1s, x2m, r1s, 1);
  // c & a
  mpc_mm256_and_def(r1m, x0s, x2m, r0s, 2);

  bitsliced_mm256_step_2(SC_PROOF);
}